

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

Light pbrt::Light::CreateArea
                (string *name,ParameterDictionary *parameters,Transform *renderFromLight,
                MediumInterface *mediumInterface,Shape *shape,FloatTexture *alpha,FileLoc *loc,
                Allocator alloc)

{
  bool bVar1;
  ParameterDictionary *in_RDX;
  FileLoc *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  undefined8 in_stack_00000018;
  Light *area;
  ParameterDictionary *in_stack_00000120;
  FileLoc *in_stack_000006c8;
  RGBColorSpace *in_stack_000006d0;
  ParameterDictionary *in_stack_000006d8;
  Medium *in_stack_000006e0;
  Transform *in_stack_000006e8;
  Allocator in_stack_000006f0;
  Shape *in_stack_00000700;
  FloatTexture *in_stack_00000708;
  FloatTexture *in_stack_ffffffffffffff48;
  DiffuseAreaLight *pDVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  Light *this;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  loc_00;
  Light local_60;
  undefined1 local_58 [72];
  Float local_10 [4];
  
  local_10._0_8_ = in_stack_00000018;
  loc_00.bits = (uint64_t)in_RDI;
  local_58._56_8_ = in_RDX;
  TaggedPointer((Light *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  bVar1 = std::operator==(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
  if (!bVar1) {
    ErrorExit<std::__cxx11::string_const&>((FileLoc *)loc_00.bits,(char *)in_RDI,in_R9);
  }
  Medium::Medium((Medium *)in_stack_ffffffffffffff50,(Medium *)in_stack_ffffffffffffff48);
  ParameterDictionary::ColorSpace((ParameterDictionary *)local_58._56_8_);
  local_58._8_4_ = local_10[0];
  local_58._12_4_ = local_10[1];
  Shape::Shape((Shape *)in_stack_ffffffffffffff50,(Shape *)in_stack_ffffffffffffff48);
  FloatTexture::FloatTexture((FloatTexture *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  pDVar2 = (DiffuseAreaLight *)local_58;
  this = &local_60;
  DiffuseAreaLight::Create
            (in_stack_000006e8,in_stack_000006e0,in_stack_000006d8,in_stack_000006d0,
             in_stack_000006c8,in_stack_000006f0,in_stack_00000700,in_stack_00000708);
  TaggedPointer<pbrt::DiffuseAreaLight>(this,pDVar2);
  operator=(this,(Light *)pDVar2);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)in_RDI);
  if (!bVar1) {
    ErrorExit<std::__cxx11::string_const&>((FileLoc *)loc_00.bits,(char *)in_RDI,in_R9);
  }
  ParameterDictionary::ReportUnused(in_stack_00000120);
  return (Light)(TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                 )loc_00.bits;
}

Assistant:

Light Light::CreateArea(const std::string &name, const ParameterDictionary &parameters,
                        const Transform &renderFromLight,
                        const MediumInterface &mediumInterface, const Shape shape,
                        FloatTexture alpha, const FileLoc *loc, Allocator alloc) {
    Light area = nullptr;
    if (name == "diffuse")
        area =
            DiffuseAreaLight::Create(renderFromLight, mediumInterface.outside, parameters,
                                     parameters.ColorSpace(), loc, alloc, shape, alpha);
    else
        ErrorExit(loc, "%s: area light type unknown.", name);

    if (!area)
        ErrorExit(loc, "%s: unable to create area light.", name);

    parameters.ReportUnused();
    return area;
}